

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::DotMemberClauseSyntax>
          (DeepCloneVisitor *this,DotMemberClauseSyntax *node,BumpAllocator *alloc)

{
  DotMemberClauseSyntax *pDVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->dot,alloc);
  local_38 = parsing::Token::deepClone(&node->member,alloc);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DotMemberClauseSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return &pDVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }